

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::
       MpRepeatedVarintT<false,unsigned_int,(unsigned_short)1024>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  FieldEntry *pFVar4;
  RepeatedField<unsigned_int> *this;
  uint *puVar5;
  char *pcVar6;
  ulong uVar7;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar8;
  ParseContext *extraout_RDX;
  ulong uVar9;
  ParseContext *ctx_00;
  uint value;
  uint32_t *out;
  uint32_t next_tag;
  uint *local_38;
  
  pFVar4 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                     (table,(ulong)data.field_0 >> 0x20);
  this = RefAt<google::protobuf::RepeatedField<unsigned_int>>(msg,(ulong)pFVar4->offset);
  puVar5 = *(uint **)((long)&table->has_bits_offset +
                     (ulong)pFVar4->aux_idx * 8 + (ulong)table->aux_offset);
  local_38 = puVar5 + 2;
  do {
    out = (uint32_t *)(long)*ptr;
    if ((long)out < 0) {
      uVar9 = (long)ptr[1] << 7 | 0x7f;
      if ((long)uVar9 < 0) {
        aVar8.data = (long)ptr[2] << 0xe | 0x3fff;
        if ((long)aVar8 < 0) {
          uVar9 = uVar9 & ((long)ptr[3] << 0x15 | 0x1fffffU);
          if ((long)uVar9 < 0) {
            aVar8.data = aVar8.data & ((long)ptr[4] << 0x1c | 0xfffffffU);
            if ((long)aVar8.data < 0) {
              uVar9 = uVar9 & ((long)ptr[5] << 0x23 | 0x7ffffffffU);
              if ((long)uVar9 < 0) {
                aVar8.data = aVar8.data & ((long)ptr[6] << 0x2a | 0x3ffffffffffU);
                if ((long)aVar8 < 0) {
                  uVar9 = uVar9 & ((long)ptr[7] << 0x31 | 0x1ffffffffffffU);
                  if ((long)uVar9 < 0) {
                    uVar7 = (ulong)(byte)ptr[8] << 0x38 | 0xffffffffffffff;
                    aVar8.data = aVar8.data & uVar7;
                    if ((long)aVar8 < 0) {
                      pcVar6 = ptr + 10;
                      cVar1 = ptr[9];
                      ctx_00 = (ParseContext *)CONCAT71((int7)(uVar7 >> 8),cVar1);
                      if ((cVar1 != '\x01') && (cVar1 < '\0')) goto LAB_00378b12;
                    }
                    else {
                      pcVar6 = ptr + 9;
                    }
                  }
                  else {
                    pcVar6 = ptr + 8;
                  }
                }
                else {
                  pcVar6 = ptr + 7;
                }
              }
              else {
                pcVar6 = ptr + 6;
              }
            }
            else {
              pcVar6 = ptr + 5;
            }
          }
          else {
            pcVar6 = ptr + 4;
          }
        }
        else {
          pcVar6 = ptr + 3;
        }
        uVar9 = uVar9 & aVar8.data;
      }
      else {
        pcVar6 = ptr + 2;
      }
      out = (uint32_t *)((ulong)out & uVar9);
    }
    else {
      pcVar6 = ptr + 1;
    }
    uVar9 = (ulong)(*puVar5 >> 0x10);
    value = (uint)out;
    uVar7 = (long)(int)value - (long)(short)*puVar5;
    aVar8.data = uVar7 - uVar9;
    if (uVar9 <= uVar7) {
      uVar2 = puVar5[1];
      if ((ulong)aVar8 < (ulong)(uVar2 & 0xffff)) {
        if ((local_38[aVar8.data >> 5] >> ((uint)aVar8.data & 0x1f) & 1) == 0) {
LAB_00378b33:
          pcVar6 = MpUnknownEnumFallback(msg,ptr,ctx,data,table,hasbits);
          return pcVar6;
        }
      }
      else {
        aVar8._0_4_ = uVar2 >> 0x10;
        aVar8.data._4_4_ = 0;
        uVar9 = 0;
        do {
          if (aVar8.data <= uVar9) goto LAB_00378b33;
          uVar3 = *(uint *)((long)local_38 + uVar9 * 4 + (ulong)(uVar2 >> 3 & 0x1ffc));
          uVar9 = (uVar9 * 2 - (ulong)((int)value < (int)uVar3)) + 2;
        } while (uVar3 != value);
      }
    }
    RepeatedField<unsigned_int>::Add(this,value);
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= pcVar6) break;
    out = &next_tag;
    ptr = ReadTag(pcVar6,out,0);
    ctx_00 = extraout_RDX;
    if (ptr == (char *)0x0) {
LAB_00378b12:
      pcVar6 = Error(msg,(char *)out,ctx_00,(TcFieldData)aVar8,table,hasbits);
      return pcVar6;
    }
  } while (next_tag == data.field_0._0_4_);
  if ((ulong)table->has_bits_offset != 0) {
    puVar5 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
    *puVar5 = *puVar5 | (uint)hasbits;
  }
  return pcVar6;
}

Assistant:

const char* TcParser::MpRepeatedVarintT(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint32_t decoded_tag = data.tag();
  // For is_split we ignore the incoming xform_val and read it from entry to
  // reduce duplication for the uncommon paths.
  const uint16_t xform_val =
      is_split ? (entry.type_card & field_layout::kTvMask) : xform_val_in;
  const bool is_zigzag = xform_val == field_layout::kTvZigZag;
  const bool is_validated_enum = xform_val & field_layout::kTvEnum;

  const char* ptr2 = ptr;
  uint32_t next_tag;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  auto& field = MaybeCreateRepeatedFieldRefAt<FieldType, is_split>(
      base, entry.offset, msg);

  TcParseTableBase::FieldAux aux;
  if (is_validated_enum) {
    aux = *table->field_aux(&entry);
    PrefetchEnumData(xform_val, aux);
  }

  do {
    uint64_t tmp;
    ptr = ParseVarint(ptr2, &tmp);
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (is_validated_enum) {
      if (!EnumIsValidAux(static_cast<int32_t>(tmp), xform_val, aux)) {
        ptr = ptr2;
        PROTOBUF_MUSTTAIL return MpUnknownEnumFallback(PROTOBUF_TC_PARAM_PASS);
      }
    } else if (is_zigzag) {
      tmp = sizeof(FieldType) == 8 ? WireFormatLite::ZigZagDecode64(tmp)
                                   : WireFormatLite::ZigZagDecode32(tmp);
    }
    field.Add(static_cast<FieldType>(tmp));
    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);

parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}